

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.c
# Opt level: O2

void prf_color_palette_entry_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode != prf_color_palette_info.opcode) {
    prf_error(9,"color palette entry state method tried on node of type %d.");
    return;
  }
  if (state->color_palette == node || state->color_palette == (prf_node_t *)0x0) {
    state->color_palette = node;
    return;
  }
  prf_error(9,"color palette entry: a color palette is already registered");
  return;
}

Assistant:

static
void
prf_color_palette_entry_f(
    prf_node_t * node,
    prf_state_t * state )
{
    assert( node != NULL && state != NULL );

    if ( node->opcode != prf_color_palette_info.opcode ) {
        prf_error( 9,
            "color palette entry state method tried on node of type %d.",
            node->opcode );
        return;
    }
    if ( state->color_palette != NULL && state->color_palette != node ) {
        prf_error( 9,
            "color palette entry: a color palette is already registered" );
        return;
    }

    state->color_palette = node;
}